

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int is_transfer)

{
  byte bVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  Curl_cwriter_phase phase;
  int iVar4;
  int iVar5;
  CURLcode CVar6;
  ulong uVar7;
  size_t sVar8;
  Curl_cwriter *pCVar9;
  char *pcVar10;
  ulong max;
  char *fmt;
  Curl_cwtype *ce;
  Curl_cwtype *pCVar11;
  Curl_cwtype **ppCVar12;
  byte *pbVar13;
  bool bVar14;
  bool bVar15;
  Curl_cwriter *writer;
  CURLcode local_7c;
  Curl_cwtype *local_58;
  Curl_cwriter *local_40;
  ulong local_38;
  
  bVar14 = is_transfer == 0;
  local_38 = (ulong)bVar14;
  phase = bVar14 + 1 + (uint)bVar14;
  pcVar10 = "content";
  if (!bVar14) {
    pcVar10 = "transfer";
  }
  bVar14 = false;
  do {
    while (((ulong)(byte)*enclist < 0x2d &&
           ((0x100100000200U >> ((ulong)(byte)*enclist & 0x3f) & 1) != 0))) {
      enclist = (char *)((byte *)enclist + 1);
    }
    uVar7 = 1;
    max = 0;
    for (pbVar13 = (byte *)enclist; (bVar1 = *pbVar13, bVar1 != 0 && (bVar1 != 0x2c));
        pbVar13 = pbVar13 + 1) {
      if (' ' < (char)bVar1) {
        max = uVar7;
      }
      uVar7 = uVar7 + 1;
    }
    if (max == 0) {
LAB_0011d946:
      iVar4 = 0;
      CVar6 = local_7c;
      goto LAB_0011d949;
    }
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < Curl_trc_feat_write.log_level)) {
      Curl_trc_write(data,"looking for %s decoder: %.*s",pcVar10,max & 0xffffffff,enclist);
    }
    bVar15 = false;
    if ((is_transfer != 0) && (max == 7)) {
      iVar4 = curl_strnequal(enclist,"chunked",7);
      bVar15 = iVar4 != 0;
    }
    if (is_transfer == 0) {
      if (((data->set).field_0x8a0 & 0x20) == 0) goto LAB_0011d5aa;
LAB_0011d5f4:
      iVar5 = curl_strnequal(enclist,"identity",8);
      if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
          ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))
          ) && (0 < Curl_trc_feat_write.log_level)) {
        Curl_trc_write(data,"decoder not requested, ignored: %.*s",max & 0xffffffff,enclist);
      }
      iVar4 = 1;
      if ((is_transfer != 0) && (((data->set).field_0x8a0 & 0x10) == 0)) {
        if (bVar14) {
          fmt = "A Transfer-Encoding (%.*s) was listed after chunked";
        }
        else {
          if (iVar5 != 0) {
            iVar4 = 3;
            CVar6 = local_7c;
            goto LAB_0011d949;
          }
          fmt = "Unsolicited Transfer-Encoding (%.*s) found";
        }
        Curl_failf(data,fmt,max & 0xffffffff,enclist);
        goto LAB_0011d924;
      }
      local_7c = CURLE_OK;
      CVar6 = local_7c;
    }
    else {
      if (((data->set).field_0x89f & 1) == 0 && !bVar15) goto LAB_0011d5f4;
LAB_0011d5aa:
      sVar8 = Curl_cwriter_count(data,phase);
      if (0xfffffffffffffffa < sVar8 - 4) {
        if (((is_transfer == 0) || (iVar4 = curl_strnequal(enclist,"chunked",max), iVar4 == 0)) ||
           (local_58 = &Curl_httpchunk_unencoder, "CONNECT responded chunked"[max + 0x12] != '\0'))
        {
          ppCVar12 = general_unencoders;
          pCVar11 = &identity_encoding;
          local_58 = &Curl_httpchunk_unencoder;
          do {
            ppCVar12 = ppCVar12 + 1;
            iVar4 = curl_strnequal(enclist,pCVar11->name,max);
            if (((iVar4 == 0) || (pCVar11->name[max] != '\0')) &&
               ((pCVar11->alias == (char *)0x0 ||
                ((iVar4 = curl_strnequal(enclist,pCVar11->alias,max), iVar4 == 0 ||
                 (pCVar11->alias[max] != '\0')))))) {
              bVar3 = true;
            }
            else {
              bVar3 = false;
              local_58 = pCVar11;
            }
            if (!bVar3) goto LAB_0011d78c;
            pCVar11 = *ppCVar12;
          } while (pCVar11 != (Curl_cwtype *)0x0);
          local_58 = (Curl_cwtype *)0x0;
        }
LAB_0011d78c:
        if (((bool)(local_58 != (Curl_cwtype *)0x0 & bVar15)) &&
           (pCVar9 = Curl_cwriter_get_by_type(data,local_58), pCVar9 != (Curl_cwriter *)0x0)) {
          iVar4 = 1;
          local_7c = CURLE_OK;
          CVar6 = local_7c;
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
             (((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
               (0 < pcVar2->log_level)) && (0 < Curl_trc_feat_write.log_level)))) {
            local_7c = CURLE_OK;
            Curl_trc_write(data,"ignoring duplicate \'chunked\' decoder");
            CVar6 = local_7c;
          }
        }
        else {
          if (((local_38 & 1) == 0 && !bVar15) &&
             (pCVar9 = Curl_cwriter_get_by_name(data,"chunked"), pCVar9 != (Curl_cwriter *)0x0)) {
            Curl_failf(data,
                       "Reject response due to \'chunked\' not being the last Transfer-Encoding");
            goto LAB_0011d924;
          }
          if (local_58 == (Curl_cwtype *)0x0) {
            local_58 = &error_writer;
          }
          CVar6 = Curl_cwriter_create(&local_40,data,local_58,phase);
          if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
              ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
               (0 < pcVar2->log_level)))) && (0 < Curl_trc_feat_write.log_level)) {
            Curl_trc_write(data,"added %s decoder %s -> %d",pcVar10,local_58->name,(ulong)CVar6);
          }
          iVar4 = 1;
          if (CVar6 == CURLE_OK) {
            CVar6 = Curl_cwriter_add(data,local_40);
            if (CVar6 == CURLE_OK) {
              if (bVar15) {
                bVar14 = true;
              }
              goto LAB_0011d946;
            }
            Curl_cwriter_free(data,local_40);
          }
        }
        goto LAB_0011d949;
      }
      Curl_failf(data,"Reject response due to more than %u content encodings",5);
LAB_0011d924:
      iVar4 = 1;
      local_7c = CURLE_BAD_CONTENT_ENCODING;
      CVar6 = local_7c;
    }
LAB_0011d949:
    local_7c = CVar6;
    if ((iVar4 != 3) && (iVar4 != 0)) {
      return local_7c;
    }
    enclist = (char *)pbVar13;
    if (*pbVar13 == 0) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int is_transfer)
{
  Curl_cwriter_phase phase = is_transfer ?
    CURL_CW_TRANSFER_DECODE : CURL_CW_CONTENT_DECODE;
  CURLcode result;
  bool has_chunked = FALSE;

  do {
    const char *name;
    size_t namelen;
    bool is_chunked = FALSE;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(*enclist > ' ')
        namelen = enclist - name + 1;

    if(namelen) {
      const struct Curl_cwtype *cwt;
      struct Curl_cwriter *writer;

      CURL_TRC_WRITE(data, "looking for %s decoder: %.*s",
                     is_transfer ? "transfer" : "content", (int)namelen, name);
      is_chunked = (is_transfer && (namelen == 7) &&
                    strncasecompare(name, "chunked", 7));
      /* if we skip the decoding in this phase, do not look further.
       * Exception is "chunked" transfer-encoding which always must happen */
      if((is_transfer && !data->set.http_transfer_encoding && !is_chunked) ||
         (!is_transfer && data->set.http_ce_skip)) {
        bool is_identity = strncasecompare(name, "identity", 8);
        /* not requested, ignore */
        CURL_TRC_WRITE(data, "decoder not requested, ignored: %.*s",
                       (int)namelen, name);
        if(is_transfer && !data->set.http_te_skip) {
          if(has_chunked)
            failf(data, "A Transfer-Encoding (%.*s) was listed after chunked",
                  (int)namelen, name);
          else if(is_identity)
            continue;
          else
            failf(data, "Unsolicited Transfer-Encoding (%.*s) found",
                  (int)namelen, name);
          return CURLE_BAD_CONTENT_ENCODING;
        }
        return CURLE_OK;
      }

      if(Curl_cwriter_count(data, phase) + 1 >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to more than %u content encodings",
              MAX_ENCODE_STACK);
        return CURLE_BAD_CONTENT_ENCODING;
      }

      cwt = find_unencode_writer(name, namelen, phase);
      if(cwt && is_chunked && Curl_cwriter_get_by_type(data, cwt)) {
        /* A 'chunked' transfer encoding has already been added.
         * Ignore duplicates. See #13451.
         * Also RFC 9112, ch. 6.1:
         * "A sender MUST NOT apply the chunked transfer coding more than
         *  once to a message body."
         */
        CURL_TRC_WRITE(data, "ignoring duplicate 'chunked' decoder");
        return CURLE_OK;
      }

      if(is_transfer && !is_chunked &&
         Curl_cwriter_get_by_name(data, "chunked")) {
        /* RFC 9112, ch. 6.1:
         * "If any transfer coding other than chunked is applied to a
         *  response's content, the sender MUST either apply chunked as the
         *  final transfer coding or terminate the message by closing the
         *  connection."
         * "chunked" must be the last added to be the first in its phase,
         *  reject this.
         */
        failf(data, "Reject response due to 'chunked' not being the last "
              "Transfer-Encoding");
        return CURLE_BAD_CONTENT_ENCODING;
      }

      if(!cwt)
        cwt = &error_writer;  /* Defer error at use. */

      result = Curl_cwriter_create(&writer, data, cwt, phase);
      CURL_TRC_WRITE(data, "added %s decoder %s -> %d",
                     is_transfer ? "transfer" : "content", cwt->name, result);
      if(result)
        return result;

      result = Curl_cwriter_add(data, writer);
      if(result) {
        Curl_cwriter_free(data, writer);
        return result;
      }
      if(is_chunked)
        has_chunked = TRUE;
    }
  } while(*enclist);

  return CURLE_OK;
}